

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O0

comm * __thiscall mxx::comm::split(comm *__return_storage_ptr__,comm *this,int color)

{
  MPI_Comm poVar1;
  int iVar2;
  int color_local;
  comm *this_local;
  comm *o;
  
  comm(__return_storage_ptr__);
  poVar1 = this->mpi_comm;
  iVar2 = rank(this);
  MPI_Comm_split(poVar1,color,iVar2,&__return_storage_ptr__->mpi_comm);
  init_ranksize(__return_storage_ptr__);
  __return_storage_ptr__->do_free = true;
  return __return_storage_ptr__;
}

Assistant:

comm split(int color) const {
        comm o;
        MPI_Comm_split(this->mpi_comm, color, this->rank(), &o.mpi_comm);
        o.init_ranksize();
        o.do_free = true;
        return o;
    }